

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGuiListClipper::ForceDisplayRangeByIndices(ImGuiListClipper *this,int item_min,int item_max)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  void *__dest;
  int iVar5;
  int iVar6;
  
  if (item_min < item_max) {
    pvVar2 = this->TempData;
    iVar4 = *(int *)((long)pvVar2 + 0x18);
    if (iVar4 == *(int *)((long)pvVar2 + 0x1c)) {
      if (iVar4 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar4 / 2 + iVar4;
      }
      iVar6 = iVar4 + 1;
      if (iVar4 + 1 < iVar5) {
        iVar6 = iVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (*GImAllocatorAllocFunc)((long)iVar6 * 0xc,GImAllocatorUserData);
      if (*(void **)((long)pvVar2 + 0x20) != (void *)0x0) {
        memcpy(__dest,*(void **)((long)pvVar2 + 0x20),(long)*(int *)((long)pvVar2 + 0x18) * 0xc);
        pvVar3 = *(void **)((long)pvVar2 + 0x20);
        if ((pvVar3 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      *(void **)((long)pvVar2 + 0x20) = __dest;
      *(int *)((long)pvVar2 + 0x1c) = iVar6;
      iVar4 = *(int *)((long)pvVar2 + 0x18);
    }
    else {
      __dest = *(void **)((long)pvVar2 + 0x20);
    }
    *(ulong *)((long)__dest + (long)iVar4 * 0xc) = CONCAT44(item_max,item_min);
    *(undefined4 *)((long)__dest + (long)iVar4 * 0xc + 8) = 0;
    *(int *)((long)pvVar2 + 0x18) = *(int *)((long)pvVar2 + 0x18) + 1;
  }
  return;
}

Assistant:

void ImGuiListClipper::ForceDisplayRangeByIndices(int item_min, int item_max)
{
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(DisplayStart < 0); // Only allowed after Begin() and if there has not been a specified range yet.
    IM_ASSERT(item_min <= item_max);
    if (item_min < item_max)
        data->Ranges.push_back(ImGuiListClipperRange::FromIndices(item_min, item_max));
}